

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

roaring_bitmap_t *
roaring_bitmap_flip_closed(roaring_bitmap_t *x1,uint32_t range_start,uint32_t range_end)

{
  uint16_t hb;
  _Bool _Var1;
  uint8_t uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  roaring_bitmap_t *prVar6;
  roaring_array_t *ra;
  run_container_t *c;
  uint16_t stopping_key;
  uint16_t uVar7;
  uint uVar8;
  array_container_t *src;
  bool bVar9;
  run_container_t *local_40;
  uint local_34;
  
  if (range_end < range_start) {
    prVar6 = roaring_bitmap_copy(x1);
    return prVar6;
  }
  ra = &roaring_bitmap_create()->high_low_container;
  ra->flags = ra->flags & 0xfe | (x1->high_low_container).flags & 1;
  uVar8 = range_start >> 0x10;
  stopping_key = (uint16_t)(range_start >> 0x10);
  ra_append_copies_until
            (ra,&x1->high_low_container,stopping_key,(_Bool)((x1->high_low_container).flags & 1));
  uVar7 = (uint16_t)range_start;
  hb = (uint16_t)(range_end >> 0x10);
  if (uVar8 == range_end >> 0x10) {
    insert_flipped_container(ra,&x1->high_low_container,stopping_key,uVar7,(uint16_t)range_end);
  }
  else {
    if (uVar7 != 0) {
      insert_flipped_container(ra,&x1->high_low_container,stopping_key,uVar7,0xffff);
      uVar8 = uVar8 + 1 & 0xffff;
    }
    local_34 = range_end & 0xffff;
    bVar9 = local_34 != 0xffff;
    for (; uVar8 <= ((range_end >> 0x10) - (uint)bVar9 & 0xffff); uVar8 = uVar8 + 1) {
      uVar7 = (uint16_t)uVar8;
      uVar3 = ra_get_index(&x1->high_low_container,uVar7);
      uVar4 = ra_get_index(ra,uVar7);
      if ((int)uVar3 < 0) {
        c = run_container_create_range(0,0x10000);
        uVar2 = '\x03';
LAB_00107153:
        ra_insert_new_key_value_at(ra,~uVar4,uVar7,c,uVar2);
      }
      else {
        uVar2 = (x1->high_low_container).typecodes[uVar3 & 0xffff];
        src = (array_container_t *)(x1->high_low_container).containers[uVar3 & 0xffff];
        if (uVar2 == '\x04') {
          uVar2 = *(uint8_t *)&src->array;
          src = *(array_container_t **)src;
        }
        local_40 = (run_container_t *)0x0;
        if (uVar2 == '\x03') {
          iVar5 = run_container_negation((run_container_t *)src,&local_40);
          uVar2 = (uint8_t)iVar5;
        }
        else if (uVar2 == '\x02') {
          local_40 = (run_container_t *)bitset_container_create();
          array_container_negation(src,(bitset_container_t *)local_40);
          uVar2 = '\x01';
        }
        else {
          _Var1 = bitset_container_negation((bitset_container_t *)src,&local_40);
          uVar2 = '\x02' - _Var1;
        }
        c = local_40;
        iVar5 = container_get_cardinality(local_40,uVar2);
        if (iVar5 != 0) goto LAB_00107153;
        container_free(c,uVar2);
      }
    }
    if (local_34 != 0xffff) {
      insert_flipped_container(ra,&x1->high_low_container,hb,0,(uint16_t)range_end);
    }
  }
  ra_append_copies_after(ra,&x1->high_low_container,hb,(_Bool)((x1->high_low_container).flags & 1));
  return (roaring_bitmap_t *)ra;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_flip_closed(const roaring_bitmap_t *x1,
                                             uint32_t range_start,
                                             uint32_t range_end) {
    if (range_start > range_end) {
        return roaring_bitmap_copy(x1);
    }

    roaring_bitmap_t *ans = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(ans, is_cow(x1));

    uint16_t hb_start = (uint16_t)(range_start >> 16);
    const uint16_t lb_start = (uint16_t)range_start;  // & 0xFFFF;
    uint16_t hb_end = (uint16_t)(range_end >> 16);
    const uint16_t lb_end = (uint16_t)range_end;  // & 0xFFFF;

    ra_append_copies_until(&ans->high_low_container, &x1->high_low_container,
                           hb_start, is_cow(x1));
    if (hb_start == hb_end) {
        insert_flipped_container(&ans->high_low_container,
                                 &x1->high_low_container, hb_start, lb_start,
                                 lb_end);
    } else {
        // start and end containers are distinct
        if (lb_start > 0) {
            // handle first (partial) container
            insert_flipped_container(&ans->high_low_container,
                                     &x1->high_low_container, hb_start,
                                     lb_start, 0xFFFF);
            ++hb_start;  // for the full containers.  Can't wrap.
        }

        if (lb_end != 0xFFFF) --hb_end;  // later we'll handle the partial block

        for (uint32_t hb = hb_start; hb <= hb_end; ++hb) {
            insert_fully_flipped_container(&ans->high_low_container,
                                           &x1->high_low_container,
                                           (uint16_t)hb);
        }

        // handle a partial final container
        if (lb_end != 0xFFFF) {
            insert_flipped_container(&ans->high_low_container,
                                     &x1->high_low_container, hb_end + 1, 0,
                                     lb_end);
            ++hb_end;
        }
    }
    ra_append_copies_after(&ans->high_low_container, &x1->high_low_container,
                           hb_end, is_cow(x1));
    return ans;
}